

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O1

void sysbvm_methodDictionary_atPut
               (sysbvm_context_t *context,sysbvm_tuple_t dictionary,sysbvm_tuple_t key,
               sysbvm_tuple_t value)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int64_t svalue;
  
  if ((key != 0x3f) && ((dictionary & 0xf) == 0 && dictionary != 0)) {
    lVar4 = sysbvm_methodDictionary_scanFor(dictionary,key);
    if (lVar4 < 0) {
      sysbvm_methodDictionary_increaseCapacity(context,dictionary);
      lVar4 = sysbvm_methodDictionary_scanFor(dictionary,key);
      if (lVar4 < 0) {
        sysbvm_error("Dictionary out of memory.");
        lVar4 = -1;
      }
    }
    lVar1 = *(long *)(dictionary + 0x18);
    lVar4 = lVar4 * 0x10;
    lVar2 = *(long *)(lVar1 + 0x10 + lVar4);
    *(sysbvm_tuple_t *)(lVar1 + 0x10 + lVar4) = key;
    *(sysbvm_tuple_t *)(lVar1 + 0x18 + lVar4) = value;
    if (lVar2 == 0x3f) {
      uVar6 = *(ulong *)(dictionary + 0x18);
      if ((uVar6 & 0xf) == 0 && uVar6 != 0) {
        uVar6 = (ulong)((*(uint *)(uVar6 + 0xc) >> 4) * 3 >> 2);
      }
      else {
        uVar6 = 0;
      }
      uVar3 = *(ulong *)(dictionary + 0x10);
      if (uVar3 == 0 || (uVar3 & 0xf) != 0) {
        lVar4 = (long)uVar3 >> 4;
      }
      else {
        lVar4 = *(long *)(uVar3 + 0x10);
      }
      uVar3 = lVar4 + 1;
      if (lVar4 + 0x800000000000001U >> 0x3c == 0) {
        uVar5 = uVar3 * 0x10 | 0xb;
      }
      else {
        uVar5 = sysbvm_tuple_uint64_encodeBig(context,uVar3);
      }
      *(ulong *)(dictionary + 0x10) = uVar5;
      if (uVar6 <= uVar3) {
        sysbvm_methodDictionary_increaseCapacity(context,dictionary);
        return;
      }
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_methodDictionary_atPut(sysbvm_context_t *context, sysbvm_tuple_t dictionary, sysbvm_tuple_t key, sysbvm_tuple_t value)
{
    if(key == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
        return;

    if(!sysbvm_tuple_isNonNullPointer(dictionary))
        return;

    intptr_t elementIndex = sysbvm_methodDictionary_scanFor(dictionary, key);
    if(elementIndex < 0)
    {
        sysbvm_methodDictionary_increaseCapacity(context, dictionary);
        elementIndex = sysbvm_methodDictionary_scanFor(dictionary, key);
        if(elementIndex < 0)
           sysbvm_error("Dictionary out of memory.");
    }

    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *storage = (sysbvm_array_t*)dictionaryObject->storage;
    bool isNewElement = storage->elements[elementIndex*2] == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE;
    storage->elements[elementIndex*2] = key;
    storage->elements[elementIndex*2 + 1] = value;

    // Count the newly inserted element.
    if(isNewElement)
    {
        size_t capacity = sysbvm_tuple_getSizeInSlots(dictionaryObject->storage) / 2;
        size_t newSize = sysbvm_tuple_size_decode(dictionaryObject->size) + 1;
        dictionaryObject->size = sysbvm_tuple_size_encode(context, newSize);
        size_t capacityThreshold = capacity * 3 / 4;

        // Make sure the maximum occupancy rate is not greater than 80%.
        if(newSize >= capacityThreshold)
            sysbvm_methodDictionary_increaseCapacity(context, dictionary);
    }
}